

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_237::InfoCollector::addRoot
          (InfoCollector *this,Expression *curr,PossibleContents *contents)

{
  bool bVar1;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_70;
  _Variadic_union<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  local_50;
  undefined1 local_30;
  
  bVar1 = isRelevant((InfoCollector *)curr,curr);
  if (bVar1) {
    if (*(__index_type *)
         ((long)&(contents->value).
                 super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                 .
                 super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                 .
                 super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                 .
                 super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                 .
                 super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                 .
                 super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
         + 0x18) == '\x04') {
      PossibleContents::fromType((PossibleContents *)&local_50._M_first,(Type)(curr->type).id);
      std::__detail::__variant::
      _Copy_assign_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      ::operator=((_Copy_assign_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   *)contents,
                  (_Copy_assign_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   *)&local_50._M_first);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
      ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                           *)&local_50._M_first);
    }
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       *)&local_70,
                      (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       *)contents);
    local_50._M_first._M_storage.tupleIndex = 0;
    local_30 = 0;
    local_50._M_first._M_storage.expr = curr;
    std::
    vector<std::pair<std::variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::ResultLocation,wasm::BreakTargetLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::NullLocation,wasm::ConeReadLocation>,wasm::PossibleContents>,std::allocator<std::pair<std::variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::ResultLocation,wasm::BreakTargetLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::NullLocation,wasm::ConeReadLocation>,wasm::PossibleContents>>>
    ::
    emplace_back<std::variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::ResultLocation,wasm::BreakTargetLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::NullLocation,wasm::ConeReadLocation>&,wasm::PossibleContents&>
              ((vector<std::pair<std::variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::ResultLocation,wasm::BreakTargetLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::NullLocation,wasm::ConeReadLocation>,wasm::PossibleContents>,std::allocator<std::pair<std::variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::ResultLocation,wasm::BreakTargetLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::NullLocation,wasm::ConeReadLocation>,wasm::PossibleContents>>>
                *)&this->info->roots,
               (variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                *)&local_50._M_first,(PossibleContents *)&local_70);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
    ::~_Variant_storage(&local_70);
  }
  return;
}

Assistant:

void addRoot(Expression* curr,
               PossibleContents contents = PossibleContents::many()) {
    // TODO Use a cone type here when relevant
    if (isRelevant(curr)) {
      if (contents.isMany()) {
        contents = PossibleContents::fromType(curr->type);
      }
      addRoot(ExpressionLocation{curr, 0}, contents);
    }
  }